

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::contextCallback(CLIntercept *this,string *errinfo,void *private_info,size_t cb)

{
  mutex *__mutex;
  int iVar1;
  long *plVar2;
  undefined8 uVar3;
  string *psVar4;
  long *plVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar7;
  char str [256];
  string *local_188;
  long local_180;
  string local_178;
  long local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char local_128 [256];
  
  memset(local_128,0,0x100);
  snprintf(local_128,0x100,"=======> Context Callback (private_info = %p, cb = %zu):\n",private_info
           ,cb);
  __mutex = &this->m_Mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    std::operator+(&local_148,local_128,errinfo);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_148);
    psVar4 = (string *)(plVar2 + 2);
    if ((string *)*plVar2 == psVar4) {
      local_178._M_dataplus._M_p = (psVar4->_M_dataplus)._M_p;
      local_178._M_string_length = plVar2[3];
      local_188 = &local_178;
    }
    else {
      local_178._M_dataplus._M_p = (psVar4->_M_dataplus)._M_p;
      local_188 = (string *)*plVar2;
    }
    local_180 = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_188);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      uVar6 = (undefined4)*plVar5;
      uVar7 = *(undefined4 *)((long)plVar2 + 0x14);
      local_158 = *plVar5;
      uStack_150 = (undefined4)plVar2[3];
      uStack_14c = *(undefined4 *)((long)plVar2 + 0x1c);
      local_178.field_2._M_allocated_capacity = (size_type)&local_158;
    }
    else {
      local_158 = *plVar5;
      uVar6 = extraout_XMM0_Da;
      uVar7 = extraout_XMM0_Db;
      local_178.field_2._M_allocated_capacity = (size_type)(long *)*plVar2;
    }
    local_178.field_2._8_8_ = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    log(this,(double)CONCAT44(uVar7,uVar6));
    if ((long *)local_178.field_2._M_allocated_capacity != &local_158) {
      operator_delete((void *)local_178.field_2._M_allocated_capacity);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  if ((void *)local_178.field_2._M_allocated_capacity != private_info) {
    operator_delete((void *)local_178.field_2._M_allocated_capacity);
  }
  if (local_188 != errinfo) {
    operator_delete(local_188);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void CLIntercept::contextCallback(
    const std::string& errinfo,
    const void* private_info,
    size_t cb )
{
    char    str[256] = "";
    CLI_SPRINTF( str, 256, "=======> Context Callback (private_info = %p, cb = %zu):\n",
        private_info,
        cb );

    std::lock_guard<std::mutex> lock(m_Mutex);
    log( str + errinfo + "\n" + "<======= End of Context Callback\n" );
}